

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_bool32 drwav__on_seek_memory_write(void *pUserData,int offset,drwav_seek_origin origin)

{
  ulong uVar1;
  drwav *pWav;
  
  if (pUserData != (void *)0x0) {
    if (origin == drwav_seek_origin_current) {
      uVar1 = *(ulong *)((long)pUserData + 0x118);
      if (offset < 1) {
        if (uVar1 < (uint)-offset) {
          offset = -(int)uVar1;
        }
      }
      else if (*(ulong *)((long)pUserData + 0x108) < (uint)offset + uVar1) {
        offset = (int)*(ulong *)((long)pUserData + 0x108) - (int)uVar1;
      }
      uVar1 = uVar1 + (long)offset;
    }
    else {
      uVar1 = *(ulong *)((long)pUserData + 0x108);
      if ((uint)offset <= uVar1) {
        uVar1 = (ulong)offset;
      }
    }
    *(ulong *)((long)pUserData + 0x118) = uVar1;
    return 1;
  }
  __assert_fail("pWav != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h",
                0xd0d,"drwav_bool32 drwav__on_seek_memory_write(void *, int, drwav_seek_origin)");
}

Assistant:

static drwav_bool32 drwav__on_seek_memory_write(void* pUserData, int offset, drwav_seek_origin origin)
{
    drwav* pWav = (drwav*)pUserData;
    DRWAV_ASSERT(pWav != NULL);

    if (origin == drwav_seek_origin_current) {
        if (offset > 0) {
            if (pWav->memoryStreamWrite.currentWritePos + offset > pWav->memoryStreamWrite.dataSize) {
                offset = (int)(pWav->memoryStreamWrite.dataSize - pWav->memoryStreamWrite.currentWritePos);  /* Trying to seek too far forward. */
            }
        } else {
            if (pWav->memoryStreamWrite.currentWritePos < (size_t)-offset) {
                offset = -(int)pWav->memoryStreamWrite.currentWritePos;  /* Trying to seek too far backwards. */
            }
        }

        /* This will never underflow thanks to the clamps above. */
        pWav->memoryStreamWrite.currentWritePos += offset;
    } else {
        if ((drwav_uint32)offset <= pWav->memoryStreamWrite.dataSize) {
            pWav->memoryStreamWrite.currentWritePos = offset;
        } else {
            pWav->memoryStreamWrite.currentWritePos = pWav->memoryStreamWrite.dataSize;  /* Trying to seek too far forward. */
        }
    }
    
    return DRWAV_TRUE;
}